

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O2

uint __thiscall CVmHashFuncCI::compute_hash(CVmHashFuncCI *this,char *s,size_t l)

{
  int iVar1;
  wchar_t wVar2;
  uint uVar3;
  size_t sVar4;
  
  uVar3 = 0;
  for (sVar4 = 0; l != sVar4; sVar4 = sVar4 + 1) {
    iVar1 = is_lower((int)s[sVar4]);
    wVar2 = (wchar_t)(byte)s[sVar4];
    if (iVar1 != 0) {
      wVar2 = to_upper((int)s[sVar4]);
    }
    uVar3 = uVar3 + (wVar2 & 0xffU);
  }
  return uVar3;
}

Assistant:

unsigned int CVmHashFuncCI::compute_hash(const char *s, size_t l) const
{
    uint acc;

    /*
     *   Add up all the character values in the string, converting all
     *   characters to upper-case.
     */
    for (acc = 0 ; l != 0 ; ++s, --l)
    {
        uchar c;

        c = (uchar)(is_lower(*s) ? to_upper(*s) : *s);
        acc += c;
    }

    /* return the accumulated value */
    return acc;
}